

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_13.cpp
# Opt level: O1

int main(void)

{
  iterator iVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  int *piVar7;
  int *__src;
  int *piVar8;
  int n;
  vector<int,_std::allocator<int>_> primes;
  int local_60;
  int local_5c;
  int *local_58;
  iterator iStack_50;
  int *local_48;
  int *local_38;
  
  local_58 = (int *)0x0;
  iStack_50._M_current = (int *)0x0;
  local_48 = (int *)0x0;
  local_5c = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter amount of primes to find:\n",0x20);
  std::istream::operator>>((istream *)&std::cin,&local_5c);
  local_60 = 2;
  if (0 < local_5c) {
    do {
      if (iStack_50._M_current == local_48) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_58,iStack_50,&local_60);
      }
      else {
        *iStack_50._M_current = local_60;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      local_60 = local_60 + 1;
    } while (SBORROW4(local_60,local_5c * 10) != local_60 + local_5c * -10 < 0);
  }
  if (local_58 != iStack_50._M_current) {
    piVar6 = local_58 + -1;
    lVar5 = -(long)local_58;
    piVar8 = local_58;
    piVar7 = local_58;
    do {
      lVar5 = lVar5 + -4;
      piVar7 = piVar7 + 1;
      piVar8 = piVar8 + 1;
      lVar3 = lVar5;
      __src = piVar7;
      local_38 = piVar6;
      do {
        if ((piVar6[1] != *piVar8) && (piVar6[1] % *piVar8 == 0)) {
          if (__src != iStack_50._M_current) {
            memmove(__src + -1,__src,(long)iStack_50._M_current + lVar3);
          }
          iStack_50._M_current = iStack_50._M_current + -1;
        }
        piVar6 = piVar6 + 1;
        __src = __src + 1;
        lVar3 = lVar3 + -4;
      } while (piVar6 != iStack_50._M_current);
      piVar6 = local_38 + 1;
    } while (piVar8 != iStack_50._M_current);
  }
  iVar1._M_current = iStack_50._M_current;
  if (local_58 != iStack_50._M_current) {
    iVar4 = 0;
    piVar6 = local_58;
    do {
      piVar7 = piVar6 + 1;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar6);
      local_60 = CONCAT31(local_60._1_3_,0x20);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_60,1);
      if (iVar4 == local_5c) break;
      iVar4 = iVar4 + 1;
      piVar6 = piVar7;
    } while (piVar7 != iVar1._M_current);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  if (local_58 != (int *)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return 0;
}

Assistant:

int main()
{
	std::vector<int> primes;
	auto n = 0;
	std::cout << "Enter amount of primes to find:\n";
	std::cin >> n;
	for (auto i = 2; i < n * 10; ++i)
		primes.push_back(i);

	for (auto it = primes.begin(); it != primes.end();)
	{
		auto next = it++;
		for (;;)
		{
			if (*next != *it && *next % *it == 0)
				primes.erase(next);
			if (next == primes.end())
				break;
			++next;
		}
	}

	auto cnt = 0;
	for (auto&& prime : primes)
	{
		std::cout << prime << ' ';
		if (cnt == n)
			break;
		++cnt;
	}
	std::cout << std::endl;
	return 0;
}